

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O0

int jpeg_read_header(j_decompress_ptr cinfo,boolean require_image)

{
  int iVar1;
  int in_ESI;
  long *in_RDI;
  int retcode;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((*(int *)((long)in_RDI + 0x24) != 200) && (*(int *)((long)in_RDI + 0x24) != 0xc9)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  iVar1 = jpeg_consume_input((j_decompress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      iVar1 = 1;
    }
    else if (iVar1 == 2) {
      if (in_ESI != 0) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x33;
        (**(code **)*in_RDI)(in_RDI);
      }
      jpeg_abort((j_common_ptr)CONCAT44(in_ESI,iVar1));
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

GLOBAL(int)
jpeg_read_header(j_decompress_ptr cinfo, boolean require_image)
{
  int retcode;

  if (cinfo->global_state != DSTATE_START &&
      cinfo->global_state != DSTATE_INHEADER)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  retcode = jpeg_consume_input(cinfo);

  switch (retcode) {
  case JPEG_REACHED_SOS:
    retcode = JPEG_HEADER_OK;
    break;
  case JPEG_REACHED_EOI:
    if (require_image)          /* Complain if application wanted an image */
      ERREXIT(cinfo, JERR_NO_IMAGE);
    /* Reset to start state; it would be safer to require the application to
     * call jpeg_abort, but we can't change it now for compatibility reasons.
     * A side effect is to free any temporary memory (there shouldn't be any).
     */
    jpeg_abort((j_common_ptr)cinfo); /* sets state = DSTATE_START */
    retcode = JPEG_HEADER_TABLES_ONLY;
    break;
  case JPEG_SUSPENDED:
    /* no work */
    break;
  }

  return retcode;
}